

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::global<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  size_t sVar2;
  Name *pNVar3;
  Err *pEVar4;
  Ok *__u;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar5;
  ImportNames *pIVar6;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_309;
  Err local_308;
  Err *local_2e8;
  Err *err_4;
  bool local_2d8;
  undefined7 uStack_2d7;
  size_t sStack_2d0;
  undefined1 local_2c8 [8];
  Result<wasm::Ok> _val_4;
  string local_298;
  Err local_278;
  Err local_258;
  Err *local_238;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  Result<wasm::Ok> e;
  undefined1 local_1d8 [6];
  optional<wasm::Ok> exp;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> type;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  undefined4 local_20;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  expected = sv("global",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&exports.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar3 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar3);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                __return_storage_ptr___00,&ctx->in);
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             __return_storage_ptr___00);
  local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                       ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  bVar1 = local_c0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  if (bVar1) goto LAB_0232c6c0;
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),&ctx->in);
  MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
             (MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
  pEVar4 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                     ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  if (pEVar4 != (Err *)0x0) {
    wasm::Err::Err((Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4);
    MaybeResult<wasm::Ok>::MaybeResult
              (__return_storage_ptr__,
               (Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    wasm::Err::~Err((Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  if (pEVar4 == (Err *)0x0) {
    globaltype<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_2,
               (Result<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
    if (pEVar4 != (Err *)0x0) {
      wasm::Err::Err((Err *)local_1d8,pEVar4);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_1d8);
      wasm::Err::~Err((Err *)local_1d8);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
    if (pEVar4 == (Err *)0x0) {
      std::optional<wasm::Ok>::optional
                ((optional<wasm::Ok> *)
                 ((long)&e.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x26));
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_1.val.
                                 super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         + 0x20));
      if (!bVar1) {
        expr<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
        Result<wasm::Ok>::Result
                  ((Result<wasm::Ok> *)&err_3,
                   (Result<wasm::Ok> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        local_238 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
        bVar1 = local_238 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_258,local_238);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_258);
          wasm::Err::~Err(&local_258);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
        if (!bVar1) {
          __u = Result<wasm::Ok>::operator*
                          ((Result<wasm::Ok> *)
                           ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          std::optional<wasm::Ok>::operator=
                    ((optional<wasm::Ok> *)
                     ((long)&e.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x26),__u);
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (bVar1 && bVar1) goto LAB_0232c688;
      }
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        local_2d8 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged;
        uStack_2d7 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._17_7_;
        sStack_2d0 = name.super_IString.str._M_len;
        pvVar5 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                           ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                            ((long)&_val.val.
                                    super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                    .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                    super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                    super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                    super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> +
                            0x20));
        pIVar6 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                           ((MaybeResult<wasm::WATParser::ImportNames> *)
                            ((long)&_val_1.val.
                                    super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                            + 0x20));
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        err_4._4_2_ = e.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._38_2_;
        local_20 = (undefined4)sVar2;
        ParseDeclsCtx::addGlobal
                  (local_2c8,ctx,_local_2d8,sStack_2d0,pvVar5,pIVar6,
                   e.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._38_2_,local_20);
        local_2e8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_2c8);
        bVar1 = local_2e8 == (Err *)0x0;
        if (!bVar1) {
          wasm::Err::Err(&local_308,local_2e8);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_308);
          wasm::Err::~Err(&local_308);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_2c8);
        if (bVar1) {
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_309);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"expected end of global",
                   (allocator<char> *)
                   ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        Lexer::err(&local_278,&ctx->in,&local_298);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_278);
        wasm::Err::~Err(&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      }
    }
LAB_0232c688:
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
LAB_0232c6c0:
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> global(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("global"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = globaltype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::ExprT> exp;
  if (!import) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    exp = *e;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of global");
  }

  CHECK_ERR(ctx.addGlobal(name, *exports, import.getPtr(), *type, exp, pos));
  return Ok{};
}